

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::RequiredError::RequiredError(RequiredError *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                   " is required");
  RequiredError(this,(string *)&local_30,RequiredError);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit RequiredError(std::string name) : RequiredError(name + " is required", ExitCodes::RequiredError) {}